

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_59cee::tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float>::gemmMx4<3>
          (tinyBLAS_Q0_AVX<block_q5_0,_block_q8_0,_float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  block_q5_0 *pbVar4;
  block_q8_0 *pbVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  long lVar11;
  uint8_t *puVar12;
  long lVar13;
  undefined8 *puVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  __m256 Cv [4] [3];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  auVar21 = _DAT_0016b9c0;
  lVar18 = n - n0;
  lVar11 = lVar18 + 3;
  if (-1 < lVar18) {
    lVar11 = lVar18;
  }
  lVar11 = lVar11 >> 2;
  lVar19 = ((m - m0) / 3) * lVar11;
  lVar18 = (lVar19 + -1 + (long)this->nth) / (long)this->nth;
  lVar15 = this->ith * lVar18;
  lVar18 = lVar18 + lVar15;
  if (lVar19 <= lVar18) {
    lVar18 = lVar19;
  }
  if (lVar15 < lVar18) {
    lVar19 = this->k;
    pbVar4 = this->A;
    pbVar5 = this->B;
    lVar6 = this->ldb;
    lVar7 = this->lda;
    pfVar8 = this->C;
    lVar20 = this->ldc * 4;
    auVar22._8_8_ = 0x7fbfdfeff7fbfdfe;
    auVar22._0_8_ = 0x7fbfdfeff7fbfdfe;
    auVar22._16_8_ = 0x7fbfdfeff7fbfdfe;
    auVar22._24_8_ = 0x7fbfdfeff7fbfdfe;
    auVar9 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    auVar23._8_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar23._0_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar23._16_8_ = 0xf0f0f0f0f0f0f0f0;
    auVar23._24_8_ = 0xf0f0f0f0f0f0f0f0;
    do {
      lVar13 = n0 + (lVar15 % lVar11) * 4;
      local_c0 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      uStack_a8 = 0;
      uStack_a0 = 0;
      uStack_98 = 0;
      uStack_90 = 0;
      uStack_88 = 0;
      local_100 = 0;
      uStack_f8 = 0;
      uStack_f0 = 0;
      uStack_e8 = 0;
      uStack_e0 = 0;
      uStack_d8 = 0;
      uStack_d0 = 0;
      uStack_c8 = 0;
      local_140 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_110 = 0;
      uStack_108 = 0;
      local_180 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      uStack_160 = 0;
      uStack_158 = 0;
      uStack_150 = 0;
      uStack_148 = 0;
      local_1c0 = 0;
      uStack_1b8 = 0;
      uStack_1b0 = 0;
      uStack_1a8 = 0;
      uStack_1a0 = 0;
      uStack_198 = 0;
      uStack_190 = 0;
      uStack_188 = 0;
      local_200 = 0;
      uStack_1f8 = 0;
      uStack_1f0 = 0;
      uStack_1e8 = 0;
      uStack_1e0 = 0;
      uStack_1d8 = 0;
      uStack_1d0 = 0;
      uStack_1c8 = 0;
      if (0 < lVar19) {
        puVar12 = pbVar4->qh + (m0 + (lVar15 / lVar11) * 3) * lVar7 * 0x16 + -2;
        auVar26 = vpinsrw_avx(ZEXT216(pbVar5[lVar6 * lVar13].d),(uint)pbVar5[(lVar13 + 1) * lVar6].d
                              ,1);
        auVar26 = vpinsrw_avx(auVar26,(uint)pbVar5[(lVar13 + 2) * lVar6].d,2);
        auVar26 = vpinsrw_avx(auVar26,(uint)pbVar5[(lVar13 + 3) * lVar6].d,3);
        auVar26 = vcvtph2ps_f16c(auVar26);
        uVar3 = *(undefined4 *)(&ggml_table_f32_f16 + (ulong)*(ushort *)puVar12 * 4);
        auVar10._4_4_ = uVar3;
        auVar10._0_4_ = uVar3;
        auVar10._8_4_ = uVar3;
        auVar10._12_4_ = uVar3;
        vmulps_avx512vl(auVar26,auVar10);
        auVar26 = vpsrlw_avx(*(undefined1 (*) [16])(puVar12 + 6),4);
        auVar27._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * *(undefined1 (*) [16])(puVar12 + 6);
        auVar27._16_16_ = ZEXT116(1) * auVar26;
        auVar21 = vpermb_avx512vl(auVar21,ZEXT432(*(uint *)(puVar12 + 2)));
        auVar21 = vpor_avx2(auVar21,auVar22);
        auVar21 = vpcmpeqb_avx2(auVar21,auVar9);
        auVar21 = vpternlogq_avx512vl(auVar21,auVar21,auVar21,0xf);
        auVar21 = vpternlogq_avx512vl(auVar21,auVar27,auVar23,0xe4);
        vpsignb_avx2(auVar21,auVar21);
        vpsignb_avx2(*(undefined1 (*) [32])pbVar5[lVar6 * lVar13].qs,auVar21);
        halt_baddata();
      }
      lVar13 = (long)pfVar8 + lVar13 * lVar20 + (lVar15 / lVar11) * 0xc + m0 * 4;
      puVar14 = &local_200;
      lVar16 = 0;
      do {
        lVar17 = 0;
        do {
          pfVar2 = (float *)(puVar14 + lVar17 + 2);
          pfVar1 = (float *)(puVar14 + lVar17);
          auVar24._0_4_ = *pfVar2 + *pfVar1;
          auVar24._4_4_ = pfVar2[1] + pfVar1[1];
          auVar24._8_4_ = pfVar2[2] + pfVar1[2];
          auVar24._12_4_ = pfVar2[3] + pfVar1[3];
          auVar26 = vshufpd_avx(auVar24,auVar24,1);
          auVar25._0_4_ = auVar24._0_4_ + auVar26._0_4_;
          auVar25._4_4_ = auVar24._4_4_ + auVar26._4_4_;
          auVar25._8_4_ = auVar24._8_4_ + auVar26._8_4_;
          auVar25._12_4_ = auVar24._12_4_ + auVar26._12_4_;
          auVar26 = vhaddps_avx(auVar25,auVar25);
          *(int *)(lVar13 + lVar17) = auVar26._0_4_;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0xc);
        lVar16 = lVar16 + 1;
        puVar14 = puVar14 + 0xc;
        lVar13 = lVar13 + lVar20;
      } while (lVar16 != 4);
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar18);
  }
  return;
}

Assistant:

NOINLINE void gemmMx4(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / 4;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * 4;
            __m256 Cv[4][RM] = {};
            for (int64_t l = 0; l < k; ++l) {
                uint64_t b_delta = ((uint64_t)B[ldb * (jj + 3) + l].d << 48) | ((uint64_t)B[ldb * (jj + 2) + l].d << 32) | ((uint64_t)B[ldb * (jj + 1) + l].d << 16) | (B[ldb * (jj + 0) + l].d);
                // Convert delta values for four blocks to float values
                __m128 db = _mm_cvtph_ps(_mm_set_epi64x(0, b_delta));
                __m256i bvec0 = load(B + ldb * (jj + 0) + l);
                __m256i bvec1 = load(B + ldb * (jj + 1) + l);
                __m256i bvec2 = load(B + ldb * (jj + 2) + l);
                __m256i bvec3 = load(B + ldb * (jj + 3) + l);
                for (int64_t i = 0; i < RM; ++i) {
                    __m128 da = _mm_set1_ps(unhalf((A[lda * (ii + i) + l].d)));
                    // Computation of product of delta values for four blocks and replicate it across 256 bit lane
                    __m256 dvec =  _mm256_castps128_ps256(_mm_mul_ps(da, db));
                    dvec = _mm256_permute2f128_ps(dvec ,dvec, 0);
                    // Computation of dot product and multiplication with appropriate delta value products
                    Cv[0][i] = madd(_mm256_shuffle_ps(dvec, dvec, 0),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec0, load(A + lda * (ii + i) + l))),
                                    Cv[0][i]);
                    Cv[1][i] = madd(_mm256_shuffle_ps(dvec, dvec, 85),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec1, load(A + lda * (ii + i) + l))),
                                    Cv[1][i]);
                    Cv[2][i] = madd(_mm256_shuffle_ps(dvec, dvec, 170),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec2, load(A + lda * (ii + i) + l))),
                                    Cv[2][i]);
                    Cv[3][i] = madd(_mm256_shuffle_ps(dvec, dvec, 255),
                                    updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                            load(A + lda * (ii + i) + l)),
                                            _mm256_sign_epi8(bvec3, load(A + lda * (ii + i) + l))),
                                    Cv[3][i]);
                }
            }
            for (int64_t j = 0; j < 4; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }